

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O3

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *belief,DSPOMDP *model,
          History *history,int hstart)

{
  pointer *pppSVar1;
  iterator __position;
  bool bVar2;
  History *pHVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  pointer ppSVar6;
  log_ostream *plVar7;
  ostream *poVar8;
  pointer ppSVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  State *pSVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  double __x;
  double dVar19;
  State *particle;
  OBS_TYPE obs;
  double reward;
  int local_a4;
  double local_98;
  State *local_88;
  double local_80;
  int local_78;
  int local_74;
  ulong local_70;
  double local_68;
  double local_60;
  double local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_50;
  History *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_58 = 1.0 / (double)num;
  dVar18 = Random::NextDouble((Random *)&Random::RANDOM,0.0,local_58);
  local_68 = (*(belief->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < num) {
    local_78 = num * 200;
    local_80 = -INFINITY;
    local_70 = (ulong)hstart;
    iVar12 = 0;
    iVar15 = 0;
    local_a4 = 0;
    local_50 = belief;
    local_48 = history;
    do {
      pHVar3 = local_48;
      ppSVar6 = (local_50->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if (dVar18 <= local_68) {
        pSVar13 = ppSVar6[iVar12];
      }
      else {
        do {
          iVar12 = iVar12 + 1;
          if ((long)(local_50->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3 == (long)iVar12
             ) {
            iVar12 = 0;
          }
          pSVar13 = ppSVar6[iVar12];
          local_68 = local_68 + pSVar13->weight;
        } while (local_68 < dVar18);
      }
      local_60 = dVar18;
      iVar4 = (*model->_vptr_DSPOMDP[0x16])(model,pSVar13);
      local_88 = (State *)CONCAT44(extraout_var,iVar4);
      local_98 = 0.0;
      local_74 = iVar15;
      if (local_70 <
          (ulong)((long)(pHVar3->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pHVar3->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        local_98 = 0.0;
        uVar10 = local_70;
        do {
          pSVar13 = local_88;
          Random::NextDouble((Random *)&Random::RANDOM);
          (*model->_vptr_DSPOMDP[2])
                    (model,pSVar13,
                     (ulong)(uint)(pHVar3->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10],local_38,local_40
                    );
          (*model->_vptr_DSPOMDP[7])
                    (model,(pHVar3->observations_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10],local_88,
                     (ulong)(uint)(pHVar3->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10]);
          if (__x <= 0.0) {
            (*model->_vptr_DSPOMDP[0x17])(model,local_88);
            break;
          }
          dVar18 = log(__x);
          local_98 = local_98 + dVar18;
          uVar10 = uVar10 + 1;
        } while (uVar10 < (ulong)((long)(pHVar3->actions_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)(pHVar3->actions_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2));
      }
      if ((local_88->super_MemoryObject).allocated_ == true) {
        local_88->weight = local_98;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__
                     ,__position,&local_88);
        }
        else {
          *__position._M_current = local_88;
          pppSVar1 = &(__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        local_a4 = local_a4 + 1;
        if (local_80 <= local_98) {
          local_80 = local_98;
        }
      }
      if (local_a4 == num) {
        uVar5 = (int)((ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->
                                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
        if ((int)uVar5 < 0) break;
        uVar10 = (ulong)uVar5;
        uVar14 = uVar10 * 8 ^ 0xfffffffffffffff8;
        lVar11 = uVar10 * 8 + 8;
        lVar16 = uVar10 + 1;
        local_a4 = num;
        do {
          dVar18 = (__return_storage_ptr__->
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar16 + -1]->weight - local_80;
          dVar19 = log(local_58);
          if (dVar18 < dVar19) {
            (*model->_vptr_DSPOMDP[0x17])
                      (model,(__return_storage_ptr__->
                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar16 + -1]);
            ppSVar6 = (__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            ppSVar9 = (__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            if ((pointer)((long)ppSVar6 + lVar11) != ppSVar9) {
              memmove(ppSVar6 + lVar16 + -1,ppSVar6 + lVar16,
                      (long)ppSVar9 + (uVar14 - (long)ppSVar6));
              ppSVar9 = (__return_storage_ptr__->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_finish = ppSVar9 + -1;
            local_a4 = local_a4 + -1;
          }
          uVar14 = uVar14 + 8;
          lVar11 = lVar11 + -8;
          lVar17 = lVar16 + -1;
          bVar2 = 0 < lVar16;
          lVar16 = lVar17;
        } while (lVar17 != 0 && bVar2);
      }
      if (num <= local_a4) break;
      iVar15 = local_74 + 1;
      dVar18 = local_60 + local_58;
    } while (iVar15 < local_78);
    ppSVar6 = (__return_storage_ptr__->
              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppSVar6) {
      uVar10 = 0;
      dVar18 = 0.0;
    }
    else {
      dVar18 = 0.0;
      uVar14 = 0;
      do {
        dVar19 = exp(ppSVar6[uVar14]->weight - local_80);
        ppSVar6 = (__return_storage_ptr__->
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar6[uVar14]->weight = dVar19;
        dVar18 = dVar18 + dVar19;
        uVar14 = uVar14 + 1;
        uVar10 = (long)(__return_storage_ptr__->
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar6 >> 3;
      } while (uVar14 < uVar10);
    }
    if (uVar10 != 0) {
      uVar14 = 0;
      do {
        ppSVar6[uVar14]->weight = ppSVar6[uVar14]->weight / dVar18;
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
  }
  iVar12 = logging::level();
  if ((0 < iVar12) && (iVar12 = logging::level(), 3 < iVar12)) {
    plVar7 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar7->super_ostream,"[Belief::Resample] Resampled ",0x1d);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)plVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," particles",10);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      iVar12 = logging::level();
      if ((0 < iVar12) && (iVar12 = logging::level(), 4 < iVar12)) {
        plVar7 = logging::stream(5);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar7->super_ostream," ",1);
        poVar8 = (ostream *)std::ostream::operator<<(plVar7,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = despot::operator<<(poVar8,(__return_storage_ptr__->
                                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar10]);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const vector<State*>& belief,
	const DSPOMDP* model, History history, int hstart) {
	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = belief[0]->weight;

	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	double max_wgt = Globals::NEG_INFTY;
	int trial = 0;
	while (count < num && trial < 200 * num) {
		// Pick next particle
		while (mass > cur) {
			pos++;
			if (pos == belief.size())
				pos = 0;

			cur += belief[pos]->weight;
		}
		trial++;

		mass += unit;

		State* particle = model->Copy(belief[pos]);

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			model->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = model->ObsProb(history.Observation(i), *particle,
				history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				model->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			count++;

			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--)
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					model->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
		}
	}

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}